

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O0

exr_result_t
internal_coding_update_channel_info
          (exr_coding_channel_info_t *channels,int16_t num_chans,exr_chunk_info_t *cinfo,
          exr_const_context_t ctxt,exr_const_priv_part_t part)

{
  int iVar1;
  int *piVar2;
  undefined1 uVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  long in_RCX;
  long in_RDX;
  short in_SI;
  long in_RDI;
  long in_R8;
  exr_coding_channel_info_t *ccic;
  exr_attr_chlist_entry_t *curc;
  int c;
  exr_attr_chlist_t *chanlist;
  int chans;
  int local_44;
  exr_result_t local_4;
  
  piVar2 = *(int **)(*(long *)(in_R8 + 0x20) + 0x18);
  iVar1 = *piVar2;
  if (in_SI == iVar1) {
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      lVar5 = *(long *)(piVar2 + 2) + (long)local_44 * 0x20;
      puVar6 = (undefined8 *)(in_RDI + (long)local_44 * 0x30);
      *puVar6 = *(undefined8 *)(lVar5 + 8);
      iVar4 = compute_sampled_height
                        (*(int *)(in_RDX + 0xc),*(int *)(lVar5 + 0x1c),*(int *)(in_RDX + 8));
      *(int *)(puVar6 + 1) = iVar4;
      iVar4 = compute_sampled_width
                        (*(int *)(in_RDX + 0x10),*(int *)(lVar5 + 0x18),*(int *)(in_RDX + 4));
      *(int *)((long)puVar6 + 0xc) = iVar4;
      *(undefined4 *)(puVar6 + 2) = *(undefined4 *)(lVar5 + 0x18);
      *(undefined4 *)((long)puVar6 + 0x14) = *(undefined4 *)(lVar5 + 0x1c);
      *(undefined1 *)(puVar6 + 3) = *(undefined1 *)(lVar5 + 0x14);
      uVar3 = 4;
      if (*(int *)(lVar5 + 0x10) == 1) {
        uVar3 = 2;
      }
      *(undefined1 *)((long)puVar6 + 0x19) = uVar3;
      *(short *)((long)puVar6 + 0x1a) = (short)*(undefined4 *)(lVar5 + 0x10);
    }
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RCX + 0x48))
                        (in_RCX,3,"Mismatch in channel counts: stored %d, incoming %d",(int)in_SI,
                         iVar1);
  }
  return local_4;
}

Assistant:

exr_result_t
internal_coding_update_channel_info (
    exr_coding_channel_info_t* channels,
    int16_t                    num_chans,
    const exr_chunk_info_t*    cinfo,
    exr_const_context_t        ctxt,
    exr_const_priv_part_t      part)
{
    int                chans;
    exr_attr_chlist_t* chanlist;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;

    if (num_chans != chans)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Mismatch in channel counts: stored %d, incoming %d",
            num_chans,
            chans);

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     ccic = (channels + c);

        ccic->channel_name = curc->name.str;

        ccic->height = compute_sampled_height (
            cinfo->height, curc->y_sampling, cinfo->start_y);
        ccic->width = compute_sampled_width (
            cinfo->width, curc->x_sampling, cinfo->start_x);

        ccic->x_samples = curc->x_sampling;
        ccic->y_samples = curc->y_sampling;

        ccic->p_linear          = curc->p_linear;
        ccic->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        ccic->data_type         = (uint16_t) (curc->pixel_type);
    }

    return EXR_ERR_SUCCESS;
}